

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::declareBlock
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TString *instanceName)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  TSymbolTable *pTVar3;
  bool memberWithoutLocation;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TTypeList *pTVar7;
  undefined4 extraout_var;
  TType *pTVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TQualifier *pTVar9;
  undefined4 extraout_var_04;
  iterator iVar10;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TString *n;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  TVariable *this_00;
  undefined4 extraout_var_23;
  bool bVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  TSourceLoc *pTVar16;
  TQualifier *pTVar17;
  HlslParseContext *pHVar18;
  HlslParseContext *pHVar19;
  _func_int **pp_Var20;
  ulong uVar21;
  byte bVar22;
  TQualifier defaultQualification;
  TType blockType;
  undefined4 extraout_var_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_20;
  
  bVar22 = 0;
  pTVar8 = (TType *)loc;
  pTVar7 = TType::getWritableStruct(type);
  if (pTVar7 == (TTypeList *)0x0) {
    __assert_fail("type.getWritableStruct() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x224e,
                  "void glslang::HlslParseContext::declareBlock(const TSourceLoc &, TType &, const TString *)"
                 );
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  uVar5 = *(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f;
  if (uVar5 - 5 < 2) {
    pHVar18 = (HlslParseContext *)type;
    iVar4 = (*type->_vptr_TType[10])();
    pTVar8 = (TType *)CONCAT44(extraout_var_01,iVar4);
    correctUniform(pHVar18,(TQualifier *)pTVar8);
  }
  else if (uVar5 == 3) {
    iVar4 = (*type->_vptr_TType[10])(type);
    pTVar8 = (TType *)CONCAT44(extraout_var_02,iVar4);
    correctInput(this,(TQualifier *)pTVar8);
  }
  else if (uVar5 == 4) {
    iVar4 = (*type->_vptr_TType[10])(type);
    pTVar8 = (TType *)CONCAT44(extraout_var_00,iVar4);
    correctOutput(this,(TQualifier *)pTVar8);
  }
  pTVar7 = TType::getWritableStruct(type);
  p_Var1 = &(this->ioTypeMap).
            super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  uVar5 = 0;
  while( true ) {
    pTVar2 = (pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar7->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5) <=
        (ulong)uVar5) break;
    pHVar18 = (HlslParseContext *)pTVar2[uVar5].type;
    pHVar19 = pHVar18;
    iVar4 = (*(pHVar18->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
    pTVar9 = (TQualifier *)CONCAT44(extraout_var_03,iVar4);
    globalQualifierFix(pHVar19,(TSourceLoc *)pTVar8,pTVar9);
    iVar4 = (*type->_vptr_TType[10])(type);
    *(ulong *)&pTVar9->field_0x8 =
         *(ulong *)&pTVar9->field_0x8 & 0xffffffffffffff80 |
         (ulong)((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0x7f);
    iVar4 = (*(pHVar18->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x25])
                      (pHVar18);
    if ((char)iVar4 != '\0') {
      blockType._vptr_TType = (_func_int **)TType::getStruct((TType *)pHVar18);
      pTVar8 = &blockType;
      iVar10 = std::
               _Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
               ::find((_Rb_tree<const_glslang::TVector<glslang::TTypeLoc>_*,_std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>,_std::_Select1st<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                       *)&this->ioTypeMap,(key_type *)pTVar8);
      iVar4 = (*type->_vptr_TType[10])(type);
      uVar6 = *(uint *)(CONCAT44(extraout_var_05,iVar4) + 8) & 0x7f;
      if (uVar6 - 5 < 2) {
        pHVar19 = (HlslParseContext *)type;
        iVar4 = (*type->_vptr_TType[10])();
        pTVar8 = (TType *)CONCAT44(extraout_var_07,iVar4);
        correctUniform(pHVar19,(TQualifier *)pTVar8);
        if ((_Rb_tree_header *)iVar10._M_node != p_Var1) {
          pTVar8 = (TType *)iVar10._M_node[1]._M_right;
LAB_0038f73f:
          if (pTVar8 != (TType *)0x0) {
            TType::setStruct((TType *)pHVar18,(TTypeList *)pTVar8);
          }
        }
      }
      else if (uVar6 == 3) {
        iVar4 = (*type->_vptr_TType[10])(type);
        pTVar8 = (TType *)CONCAT44(extraout_var_08,iVar4);
        correctInput(this,(TQualifier *)pTVar8);
        if ((_Rb_tree_header *)iVar10._M_node != p_Var1) {
          pTVar8 = (TType *)iVar10._M_node[1]._M_parent;
          goto LAB_0038f73f;
        }
      }
      else if (uVar6 == 4) {
        iVar4 = (*type->_vptr_TType[10])(type);
        pTVar8 = (TType *)CONCAT44(extraout_var_06,iVar4);
        correctOutput(this,(TQualifier *)pTVar8);
        if ((_Rb_tree_header *)iVar10._M_node != p_Var1) {
          pTVar8 = (TType *)iVar10._M_node[1]._M_left;
          goto LAB_0038f73f;
        }
      }
    }
    uVar5 = uVar5 + 1;
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  switch(*(uint *)(CONCAT44(extraout_var_09,iVar4) + 8) & 0x7f) {
  case 3:
    pTVar9 = &this->globalInputDefaults;
    break;
  case 4:
    pTVar9 = &this->globalOutputDefaults;
    break;
  case 5:
    pTVar9 = &this->globalUniformDefaults;
    break;
  case 6:
    pTVar9 = &this->globalBufferDefaults;
    break;
  default:
    TQualifier::clear(&defaultQualification);
    goto LAB_0038f7b1;
  }
  pTVar17 = &defaultQualification;
  for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
    pTVar17->semanticName = pTVar9->semanticName;
    pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar22 * -0x10 + 8);
    pTVar17 = (TQualifier *)((long)pTVar17 + (ulong)bVar22 * -0x10 + 8);
  }
LAB_0038f7b1:
  iVar4 = (*type->_vptr_TType[10])(type);
  if ((*(char *)(CONCAT44(extraout_var_10,iVar4) + 0x2d) == '\x01') &&
     (iVar4 = (*type->_vptr_TType[10])(type),
     (*(byte *)(CONCAT44(extraout_var_11,iVar4) + 0x10) & 0xf) == 0)) {
    iVar4 = (*type->_vptr_TType[10])(type);
    *(byte *)(CONCAT44(extraout_var_12,iVar4) + 0x10) =
         *(byte *)(CONCAT44(extraout_var_12,iVar4) + 0x10) & 0xf0 | 3;
  }
  pHVar18 = (HlslParseContext *)type;
  iVar4 = (*type->_vptr_TType[10])();
  mergeObjectLayoutQualifiers
            (pHVar18,&defaultQualification,(TQualifier *)CONCAT44(extraout_var_13,iVar4),true);
  memberWithoutLocation = false;
  uVar5 = 0;
  bVar11 = false;
  while( true ) {
    uVar21 = (ulong)uVar5;
    pTVar2 = (pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pTVar7->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 5) <= uVar21)
    break;
    iVar4 = (*(pTVar2[uVar21].type)->_vptr_TType[10])();
    pTVar9 = (TQualifier *)CONCAT44(extraout_var_14,iVar4);
    pTVar16 = &(pTVar7->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar21].loc;
    if (((char)(*(ulong *)&pTVar9->field_0x1c >> 0x38) != -1) &&
       ((*(ulong *)&pTVar9->field_0x1c ^ defaultQualification._28_8_) >> 0x38 != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"member cannot contradict block","stream","");
    }
    uVar6 = (uint)*(undefined8 *)&pTVar9->field_0x24;
    if (((~uVar6 & 0xf) != 0) && (((uVar6 ^ defaultQualification._36_4_) & 0xf) != 0)) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar16,"member cannot contradict block (or what block inherited from global)"
                 ,"xfb_buffer","");
    }
    if ((~*(uint *)&pTVar9->field_0x1c & 0xfff) == 0) {
      memberWithoutLocation = true;
    }
    else {
      iVar4 = (*type->_vptr_TType[10])(type);
      bVar11 = (bool)(bVar11 | (*(uint *)(CONCAT44(extraout_var_15,iVar4) + 8) & 0x7f) - 3 < 2);
    }
    lVar13 = 10;
    pTVar17 = &defaultQualification;
    pTVar8 = &blockType;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      pTVar8->_vptr_TType = (_func_int **)pTVar17->semanticName;
      pTVar17 = (TQualifier *)((long)pTVar17 + (ulong)bVar22 * -0x10 + 8);
      pTVar8 = (TType *)((long)pTVar8 + (ulong)bVar22 * -0x10 + 8);
    }
    mergeQualifiers(this,(TQualifier *)&blockType,pTVar9);
    pTVar8 = &blockType;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      pTVar9->semanticName = (char *)pTVar8->_vptr_TType;
      pTVar8 = (TType *)((long)pTVar8 + (ulong)bVar22 * -0x10 + 8);
      pTVar9 = (TQualifier *)((long)pTVar9 + (ulong)bVar22 * -0x10 + 8);
    }
    uVar5 = uVar5 + 1;
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  fixBlockLocations(this,loc,(TQualifier *)CONCAT44(extraout_var_16,iVar4),pTVar7,bVar11,
                    memberWithoutLocation);
  iVar4 = (*type->_vptr_TType[10])(type);
  fixXfbOffsets(this,(TQualifier *)CONCAT44(extraout_var_17,iVar4),pTVar7);
  iVar4 = (*type->_vptr_TType[10])(type);
  fixBlockUniformOffsets(this,(TQualifier *)CONCAT44(extraout_var_18,iVar4),pTVar7);
  pHVar18 = (HlslParseContext *)type;
  iVar4 = (*type->_vptr_TType[10])();
  mergeObjectLayoutQualifiers
            (pHVar18,(TQualifier *)CONCAT44(extraout_var_19,iVar4),&defaultQualification,true);
  if ((instanceName == (TString *)0x0) || (n = instanceName, instanceName->_M_string_length == 0)) {
    iVar4 = (*type->_vptr_TType[5])(type);
    n = (TString *)CONCAT44(extraout_var_20,iVar4);
  }
  iVar4 = (*type->_vptr_TType[10])(type);
  TType::TType(&blockType,pTVar7,n,(TQualifier *)CONCAT44(extraout_var_21,iVar4));
  iVar4 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar4 != '\0') {
    iVar4 = (*type->_vptr_TType[0x14])(type);
    blockType.arraySizes = (TArraySizes *)CONCAT44(extraout_var_22,iVar4);
  }
  if (instanceName == (TString *)0x0) {
    instanceName = NewPoolTString_abi_cxx11_("");
  }
  this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)pTVar7);
  TVariable::TVariable(this_00,instanceName,&blockType,false);
  bVar11 = TSymbolTable::insert((this->super_TParseContextBase).symbolTable,(TSymbol *)this_00);
  if (bVar11) {
    pTVar3 = (this->super_TParseContextBase).symbolTable;
    if ((int)((ulong)((long)(pTVar3->table).
                            super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pTVar3->table).
                           super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) < 5) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,this_00);
    }
  }
  else {
    bVar11 = std::operator==(instanceName,"");
    if (bVar11) {
      pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "nameless block contains a member that already has a name at global scope";
      pcVar14 = "";
    }
    else {
      iVar4 = (*(this_00->super_TSymbol)._vptr_TSymbol[3])(this_00);
      pcVar14 = *(char **)(CONCAT44(extraout_var_23,iVar4) + 8);
      pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar15 = "block instance name redefinition";
    }
    (*pp_Var20[0x2d])(this,loc,pcVar15,pcVar14,"");
  }
  return;
}

Assistant:

void HlslParseContext::declareBlock(const TSourceLoc& loc, TType& type, const TString* instanceName)
{
    assert(type.getWritableStruct() != nullptr);

    // Clean up top-level decorations that don't belong.
    switch (type.getQualifier().storage) {
    case EvqUniform:
    case EvqBuffer:
        correctUniform(type.getQualifier());
        break;
    case EvqVaryingIn:
        correctInput(type.getQualifier());
        break;
    case EvqVaryingOut:
        correctOutput(type.getQualifier());
        break;
    default:
        break;
    }

    TTypeList& typeList = *type.getWritableStruct();
    // fix and check for member storage qualifiers and types that don't belong within a block
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TType& memberType = *typeList[member].type;
        TQualifier& memberQualifier = memberType.getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        globalQualifierFix(memberLoc, memberQualifier);
        memberQualifier.storage = type.getQualifier().storage;

        if (memberType.isStruct()) {
            // clean up and pick up the right set of decorations
            auto it = ioTypeMap.find(memberType.getStruct());
            switch (type.getQualifier().storage) {
            case EvqUniform:
            case EvqBuffer:
                correctUniform(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.uniform)
                    memberType.setStruct(it->second.uniform);
                break;
            case EvqVaryingIn:
                correctInput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.input)
                    memberType.setStruct(it->second.input);
                break;
            case EvqVaryingOut:
                correctOutput(type.getQualifier());
                if (it != ioTypeMap.end() && it->second.output)
                    memberType.setStruct(it->second.output);
                break;
            default:
                break;
            }
        }
    }

    // Make default block qualification, and adjust the member qualifications

    TQualifier defaultQualification;
    switch (type.getQualifier().storage) {
    case EvqUniform:    defaultQualification = globalUniformDefaults;    break;
    case EvqBuffer:     defaultQualification = globalBufferDefaults;     break;
    case EvqVaryingIn:  defaultQualification = globalInputDefaults;      break;
    case EvqVaryingOut: defaultQualification = globalOutputDefaults;     break;
    default:            defaultQualification.clear();                    break;
    }

    // Special case for "push_constant uniform", which has a default of std430,
    // contrary to normal uniform defaults, and can't have a default tracked for it.
    if (type.getQualifier().layoutPushConstant && ! type.getQualifier().hasPacking())
        type.getQualifier().layoutPacking = ElpStd430;

    // fix and check for member layout qualifiers

    mergeObjectLayoutQualifiers(defaultQualification, type.getQualifier(), true);

    bool memberWithLocation = false;
    bool memberWithoutLocation = false;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.hasStream()) {
            if (defaultQualification.layoutStream != memberQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block", "stream", "");
        }

        // "This includes a block's inheritance of the
        // current global default buffer, a block member's inheritance of the block's
        // buffer, and the requirement that any *xfb_buffer* declared on a block
        // member must match the buffer inherited from the block."
        if (memberQualifier.hasXfbBuffer()) {
            if (defaultQualification.layoutXfbBuffer != memberQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
        }

        if (memberQualifier.hasLocation()) {
            switch (type.getQualifier().storage) {
            case EvqVaryingIn:
            case EvqVaryingOut:
                memberWithLocation = true;
                break;
            default:
                break;
            }
        } else
            memberWithoutLocation = true;

        TQualifier newMemberQualification = defaultQualification;
        mergeQualifiers(newMemberQualification, memberQualifier);
        memberQualifier = newMemberQualification;
    }

    // Process the members
    fixBlockLocations(loc, type.getQualifier(), typeList, memberWithLocation, memberWithoutLocation);
    fixXfbOffsets(type.getQualifier(), typeList);
    fixBlockUniformOffsets(type.getQualifier(), typeList);

    // reverse merge, so that currentBlockQualifier now has all layout information
    // (can't use defaultQualification directly, it's missing other non-layout-default-class qualifiers)
    mergeObjectLayoutQualifiers(type.getQualifier(), defaultQualification, true);

    //
    // Build and add the interface block as a new type named 'blockName'
    //

    // Use the instance name as the interface name if one exists, else the block name.
    const TString& interfaceName = (instanceName && !instanceName->empty()) ? *instanceName : type.getTypeName();

    TType blockType(&typeList, interfaceName, type.getQualifier());
    if (type.isArray())
        blockType.transferArraySizes(type.getArraySizes());

    // Add the variable, as anonymous or named instanceName.
    // Make an anonymous variable if no name was provided.
    if (instanceName == nullptr)
        instanceName = NewPoolTString("");

    TVariable& variable = *new TVariable(instanceName, blockType);
    if (! symbolTable.insert(variable)) {
        if (*instanceName == "")
            error(loc, "nameless block contains a member that already has a name at global scope",
                  "" /* blockName->c_str() */, "");
        else
            error(loc, "block instance name redefinition", variable.getName().c_str(), "");

        return;
    }

    // Save it in the AST for linker use.
    if (symbolTable.atGlobalLevel())
        trackLinkage(variable);
}